

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PxVector.h
# Opt level: O1

void __thiscall hacd::vector<HACD::ChUll_*>::recreate(vector<HACD::ChUll_*> *this,HaU32 capacity)

{
  uint uVar1;
  ChUll **__ptr;
  ChUll **ppCVar2;
  ChUll **ppCVar3;
  ChUll **ppCVar4;
  
  if (capacity == 0) {
    ppCVar2 = (ChUll **)0x0;
  }
  else {
    ppCVar2 = (ChUll **)malloc((ulong)capacity << 3);
    if ((ppCVar2 == (ChUll **)0x0) || (ppCVar2 == this->mData)) {
      __assert_fail("!capacity || newData && newData != mData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/PxVector.h"
                    ,0x23b,"void hacd::vector<HACD::ChUll *>::recreate(HaU32) [T = HACD::ChUll *]");
    }
  }
  uVar1 = this->mSize;
  __ptr = this->mData;
  if ((ulong)uVar1 != 0) {
    ppCVar3 = __ptr;
    ppCVar4 = ppCVar2;
    do {
      *ppCVar4 = *ppCVar3;
      ppCVar4 = ppCVar4 + 1;
      ppCVar3 = ppCVar3 + 1;
    } while (ppCVar4 < ppCVar2 + uVar1);
  }
  if (-1 < (int)this->mCapacity) {
    free(__ptr);
  }
  this->mData = ppCVar2;
  this->mCapacity = capacity;
  return;
}

Assistant:

HACD_NOINLINE void vector<T>::recreate(HaU32 capacity)
	{
		T* newData = allocate(capacity);
		HACD_ASSERT(!capacity || newData && newData != mData);

		copy(newData, newData + mSize, mData);
		destroy(mData, mData + mSize);
		if(!isInUserMemory())
			deallocate(mData);

		mData = newData;
		mCapacity = capacity;
	}